

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall spoa::Graph::Graph(Graph *this)

{
  allocator<int> local_29;
  value_type_conflict1 local_28 [4];
  allocator<int> local_15;
  value_type_conflict1 local_14;
  Graph *local_10;
  Graph *this_local;
  
  this->num_codes_ = 0;
  local_14 = -1;
  local_10 = this;
  std::allocator<int>::allocator(&local_15);
  std::vector<int,_std::allocator<int>_>::vector(&this->coder_,0x100,&local_14,&local_15);
  std::allocator<int>::~allocator(&local_15);
  local_28[0] = -1;
  std::allocator<int>::allocator(&local_29);
  std::vector<int,_std::allocator<int>_>::vector(&this->decoder_,0x100,local_28,&local_29);
  std::allocator<int>::~allocator(&local_29);
  memset(&this->sequences_,0,0x18);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector(&this->sequences_);
  memset(&this->nodes_,0,0x18);
  std::
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ::vector(&this->nodes_);
  memset(&this->edges_,0,0x18);
  std::
  vector<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ::vector(&this->edges_);
  memset(&this->rank_to_node_,0,0x18);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector
            (&this->rank_to_node_);
  memset(&this->consensus_,0,0x18);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector(&this->consensus_);
  return;
}

Assistant:

Graph::Graph()
    : num_codes_(0),
      coder_(256, -1),
      decoder_(256, -1),
      sequences_(),
      nodes_(),
      edges_(),
      rank_to_node_(),
      consensus_() {
}